

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormulaTransformer.cpp
# Opt level: O1

Formula * __thiscall
Kernel::PolarityAwareFormulaTransformer::applyImp(PolarityAwareFormulaTransformer *this,Formula *f)

{
  int iVar1;
  Formula *pFVar2;
  Formula *pFVar3;
  Formula *pFVar4;
  void **head;
  
  iVar1 = this->_polarity;
  this->_polarity = -iVar1;
  pFVar2 = FormulaTransformer::apply(&this->super_FormulaTransformer,*(Formula **)(f + 1));
  this->_polarity = iVar1;
  pFVar3 = FormulaTransformer::apply
                     (&this->super_FormulaTransformer,(Formula *)f[1]._label._M_dataplus._M_p);
  if ((pFVar2 != *(Formula **)(f + 1)) || (pFVar3 != (Formula *)f[1]._label._M_dataplus._M_p)) {
    pFVar4 = (Formula *)
             ::Lib::FixedSizeAllocator<64UL>::alloc
                       ((FixedSizeAllocator<64UL> *)(::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
    pFVar4->_connective = f->_connective;
    (pFVar4->_label)._M_dataplus._M_p = (pointer)&(pFVar4->_label).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pFVar4->_label,Formula::DEFAULT_LABEL_abi_cxx11_,
               DAT_00b7c330 + Formula::DEFAULT_LABEL_abi_cxx11_);
    *(Formula **)(pFVar4 + 1) = pFVar2;
    pFVar4[1]._label._M_dataplus._M_p = (pointer)pFVar3;
    f = pFVar4;
  }
  return f;
}

Assistant:

Formula* PolarityAwareFormulaTransformer::applyImp(Formula* f)
{
  ASS_EQ(f->connective(),IMP);

  Formula* newLeft;
  {
    ScopedLet<int> plet(_polarity, -_polarity);
    newLeft = apply(f->left());
  }
  Formula* newRight = apply(f->right());
  if(newLeft==f->left() && newRight==f->right()) {
    return f;
  }
  return new BinaryFormula(f->connective(), newLeft, newRight);
}